

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintCommand.cpp
# Opt level: O0

void __thiscall PrintCommand::doCommand(PrintCommand *this)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  double dVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_f0;
  undefined1 local_b8 [8];
  ExpressionUtils expressionUtils;
  undefined1 local_80 [8];
  regex quote;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined1 local_38 [8];
  string_conflict toPrint;
  unsigned_long index;
  PrintCommand *this_local;
  
  toPrint.field_2._8_8_ = DataCommands::getIndex(this->dataCommands);
  DataCommands::getSeparated_abi_cxx11_(&local_50,this->dataCommands);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_50,toPrint.field_2._8_8_ + 1);
  std::__cxx11::string::string((string *)local_38,(string *)pvVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_80,"\".*\"",0x10);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_80,0);
  if (bVar1) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr
              ((ulong)&expressionUtils.deathMap.
                       super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(ulong)local_38);
    poVar3 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             &expressionUtils.deathMap.
                              super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string
              ((string *)
               &expressionUtils.deathMap.
                super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    ExpressionUtils::ExpressionUtils((ExpressionUtils *)local_b8);
    DataVars::getSymbolTable_abi_cxx11_(&local_f0,this->dataVars);
    dVar4 = ExpressionUtils::calculateInfixStr
                      ((ExpressionUtils *)local_b8,(string *)local_38,&local_f0);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::~unordered_map(&local_f0);
    ExpressionUtils::~ExpressionUtils((ExpressionUtils *)local_b8);
  }
  toPrint.field_2._8_8_ = toPrint.field_2._8_8_ + 2;
  DataCommands::setIndex(this->dataCommands,toPrint.field_2._8_8_);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_80);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void PrintCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // Set the appropriate regular expression
    string toPrint=this->dataCommands->getSeparated().at(index + 1);
    regex quote("\".*\"");
    // Returns true if the nameInSimulator matches the regular expression of quotes and returns false if not
    if(regex_match(toPrint, quote)){
        cout<<toPrint.substr(1, toPrint.size() - 2)<<endl;
    }
    else{ //print Expression
        ExpressionUtils expressionUtils;
        cout<<expressionUtils.calculateInfixStr(toPrint,dataVars->getSymbolTable())<<endl;
    }
    index += 2;
    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}